

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFS.h
# Opt level: O0

void __thiscall
dg::pta::PointerAnalysisFS::getMemoryObjects
          (PointerAnalysisFS *this,PSNode *where,Pointer *pointer,
          vector<dg::pta::MemoryObject_*,_std::allocator<dg::pta::MemoryObject_*>_> *objects)

{
  bool bVar1;
  MemoryObject *this_00;
  vector<dg::pta::MemoryObject_*,_std::allocator<dg::pta::MemoryObject_*>_> *in_RDX;
  long in_RSI;
  MemoryObject *mo;
  iterator I;
  MemoryMapT *mm;
  pointer in_stack_ffffffffffffff78;
  vector<dg::pta::MemoryObject_*,_std::allocator<dg::pta::MemoryObject_*>_>
  *in_stack_ffffffffffffff80;
  map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
  *__x;
  vector<dg::pta::MemoryObject_*,_std::allocator<dg::pta::MemoryObject_*>_>
  *in_stack_ffffffffffffff90;
  _Self local_38;
  _Self local_30;
  map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
  *local_28;
  vector<dg::pta::MemoryObject_*,_std::allocator<dg::pta::MemoryObject_*>_> *local_18;
  
  local_18 = in_RDX;
  local_28 = SubgraphNode<dg::pta::PSNode>::
             getData<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>>
                       ((SubgraphNode<dg::pta::PSNode> *)(in_RSI + 8));
  local_30._M_node =
       (_Base_ptr)
       std::
       map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
       ::find((map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
               *)in_stack_ffffffffffffff78,(key_type *)0x1679a0);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
       ::end((map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
              *)in_stack_ffffffffffffff78);
  bVar1 = std::operator!=(&local_30,&local_38);
  if (bVar1) {
    std::
    _Rb_tree_iterator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
                  *)0x1679dd);
    std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>::get
              ((unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_> *)
               0x1679e9);
    std::vector<dg::pta::MemoryObject_*,_std::allocator<dg::pta::MemoryObject_*>_>::push_back
              (in_stack_ffffffffffffff80,(value_type *)in_stack_ffffffffffffff78);
  }
  bVar1 = std::vector<dg::pta::MemoryObject_*,_std::allocator<dg::pta::MemoryObject_*>_>::empty
                    (in_stack_ffffffffffffff90);
  if ((bVar1) && (bVar1 = canChangeMM((PSNode *)in_stack_ffffffffffffff78), bVar1)) {
    this_00 = (MemoryObject *)operator_new(0x38);
    MemoryObject::MemoryObject(this_00,(PSNode *)in_stack_ffffffffffffff78);
    __x = local_28;
    std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>::
    unique_ptr<std::default_delete<dg::pta::MemoryObject>,void>
              ((unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_> *)
               this_00,in_stack_ffffffffffffff78);
    std::
    map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>
    ::
    emplace<dg::pta::PSNode*const&,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>
              ((map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
                *)local_18,(PSNode **)__x,
               (unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_> *)
               this_00);
    std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>::~unique_ptr
              ((unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_> *)
               this_00);
    std::vector<dg::pta::MemoryObject_*,_std::allocator<dg::pta::MemoryObject_*>_>::push_back
              (local_18,(value_type *)__x);
  }
  return;
}

Assistant:

void getMemoryObjects(PSNode *where, const Pointer &pointer,
                          std::vector<MemoryObject *> &objects) override {
        MemoryMapT *mm = where->getData<MemoryMapT>();
        assert(mm && "Node does not have memory map");

        auto I = mm->find(pointer.target);
        if (I != mm->end()) {
            objects.push_back(I->second.get());
        }

        // if we haven't found any memory object, but this psnode
        // is a write to memory, create a new one, so that
        // the write has something to write to
        if (objects.empty() && canChangeMM(where)) {
            MemoryObject *mo = new MemoryObject(pointer.target);
            mm->emplace(pointer.target, std::unique_ptr<MemoryObject>(mo));
            objects.push_back(mo);
        }
    }